

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_set_body(nng_http *conn,void *data,size_t sz)

{
  size_t sz_local;
  void *data_local;
  nng_http *conn_local;
  
  nni_http_set_body(conn,data,sz);
  return;
}

Assistant:

void
nng_http_set_body(nng_http *conn, void *data, size_t sz)
{
#ifdef NNG_SUPP_HTTP
	nni_http_set_body(conn, data, sz);
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(data);
	NNI_ARG_UNUSED(sz);
	return (NNG_ENOTSUP);
#endif
}